

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indiancal.cpp
# Opt level: O3

double icu_63::gregorianToJD(int32_t year,int32_t month,int32_t date)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  iVar1 = year + -1;
  iVar2 = year + 2;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  dVar3 = uprv_floor_63((double)(iVar2 >> 2));
  dVar4 = uprv_floor_63((double)(iVar1 / 100));
  dVar5 = uprv_floor_63((double)(iVar1 / 400));
  iVar2 = 0;
  if ((2 < month) &&
     (((year & 3U) != 0 ||
      ((iVar2 = -1, (year * -0x3d70a3d7 + 0x51eb850U >> 2 | year * 0x40000000) < 0x28f5c29 &&
       (year != (year / 400) * 400)))))) {
    iVar2 = -2;
  }
  dVar6 = uprv_floor_63((double)(date + iVar2 + (month * 0x16f + -0x16a) / 0xc));
  return dVar6 + (((double)(iVar1 * 0x16d) + 1721424.5 + dVar3) - dVar4) + dVar5;
}

Assistant:

static double gregorianToJD(int32_t year, int32_t month, int32_t date) {
   double julianDay = (JULIAN_EPOCH - 1) +
      (365 * (year - 1)) +
      uprv_floor((year - 1) / 4) +
      (-uprv_floor((year - 1) / 100)) +
      uprv_floor((year - 1) / 400) +
      uprv_floor((((367 * month) - 362) / 12) +
            ((month <= 2) ? 0 :
             (isGregorianLeap(year) ? -1 : -2)
            ) +
            date);

   return julianDay;
}